

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

int sve_exception_el_aarch64(CPUARMState_conflict *env,int el)

{
  uint64_t uVar1;
  ulong uVar2;
  uint uVar3;
  
  uVar1 = arm_hcr_el2_eff_aarch64(env);
  if ((~uVar1 & 0x408000000) == 0 || 1 < el) {
    if (el < 3) goto LAB_0060eade;
    uVar2 = env->features & 0x200000000;
  }
  else {
    uVar3 = (uint)(env->cp15).cpacr_el1;
    if (((uVar3 >> 0x10 & 1) == 0) || ((uVar3 & 0x20000) == 0 && el == 0)) {
      return (((uint)uVar1 >> 0x1b & 1) != 0) + 1;
    }
    if ((uVar3 >> 0x14 & 1) == 0) {
      return 0;
    }
    if ((uVar3 & 0x200000) == 0 && el == 0) {
      return 0;
    }
LAB_0060eade:
    uVar2 = env->features & 0x200000000;
    if ((uVar2 != 0) && (((env->cp15).scr_el3 & 1) == 0)) goto LAB_0060eb62;
    uVar3 = (uint)(env->cp15).cptr_el[2];
    if ((uVar3 >> 8 & 1) != 0) {
      return 2;
    }
    if ((uVar3 >> 10 & 1) != 0) {
      return 0;
    }
  }
  if (uVar2 == 0) {
    return 0;
  }
LAB_0060eb62:
  if ((*(byte *)((long)(env->cp15).cptr_el + 0x19) & 1) != 0) {
    return 0;
  }
  return 3;
}

Assistant:

int sve_exception_el(CPUARMState *env, int el)
{
    uint64_t hcr_el2 = arm_hcr_el2_eff(env);

    if (el <= 1 && (hcr_el2 & (HCR_E2H | HCR_TGE)) != (HCR_E2H | HCR_TGE)) {
        bool disabled = false;

        /* The CPACR.ZEN controls traps to EL1:
         * 0, 2 : trap EL0 and EL1 accesses
         * 1    : trap only EL0 accesses
         * 3    : trap no accesses
         */
        if (!extract32(env->cp15.cpacr_el1, 16, 1)) {
            disabled = true;
        } else if (!extract32(env->cp15.cpacr_el1, 17, 1)) {
            disabled = el == 0;
        }
        if (disabled) {
            /* route_to_el2 */
            return hcr_el2 & HCR_TGE ? 2 : 1;
        }

        /* Check CPACR.FPEN.  */
        if (!extract32(env->cp15.cpacr_el1, 20, 1)) {
            disabled = true;
        } else if (!extract32(env->cp15.cpacr_el1, 21, 1)) {
            disabled = el == 0;
        }
        if (disabled) {
            return 0;
        }
    }

    /* CPTR_EL2.  Since TZ and TFP are positive,
     * they will be zero when EL2 is not present.
     */
    if (el <= 2 && !arm_is_secure_below_el3(env)) {
        if (env->cp15.cptr_el[2] & CPTR_TZ) {
            return 2;
        }
        if (env->cp15.cptr_el[2] & CPTR_TFP) {
            return 0;
        }
    }

    /* CPTR_EL3.  Since EZ is negative we must check for EL3.  */
    if (arm_feature(env, ARM_FEATURE_EL3)
        && !(env->cp15.cptr_el[3] & CPTR_EZ)) {
        return 3;
    }
    return 0;
}